

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if (num_bits != 0) {
    iVar1 = this->m_bit_count - num_bits;
    this->m_bit_count = iVar1;
    uVar2 = bits << ((byte)iVar1 & 0x1f) | this->m_bit_buf;
    this->m_bit_buf = uVar2;
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    if (iVar1 < 0x19) {
      uVar3 = (this->m_output_buf).m_size;
      do {
        if ((this->m_output_buf).m_capacity <= uVar3) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_output_buf,uVar3 + 1,true,1,(object_mover)0x0,
                     false);
          uVar3 = (this->m_output_buf).m_size;
        }
        (this->m_output_buf).m_p[uVar3] = (uchar)(uVar2 >> 0x18);
        uVar3 = (this->m_output_buf).m_size + 1;
        (this->m_output_buf).m_size = uVar3;
        iVar1 = this->m_bit_count;
        uVar2 = this->m_bit_buf << 8;
        this->m_bit_buf = uVar2;
        this->m_bit_count = iVar1 + 8;
      } while (iVar1 < 0x11);
    }
  }
  return;
}

Assistant:

void symbol_codec::put_bits(uint bits, uint num_bits)
    {
        CRNLIB_ASSERT(num_bits <= 25);
        CRNLIB_ASSERT(m_bit_count >= 25);

        if (!num_bits)
        {
            return;
        }

        m_bit_count -= num_bits;
        m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

        m_total_bits_written += num_bits;

        while (m_bit_count <= (cBitBufSize - 8))
        {
            m_output_buf.push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8)));

            m_bit_buf <<= 8;
            m_bit_count += 8;
        }
    }